

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_list.h
# Opt level: O0

void __thiscall
JetHead::list<EventDispatcherHelper::EventListenerNode_*>::~list
          (list<EventDispatcherHelper::EventListenerNode_*> *this)

{
  Node *pNVar1;
  Node *temp;
  list<EventDispatcherHelper::EventListenerNode_*> *this_local;
  
  while (this->mHead != (Node *)0x0) {
    pNVar1 = this->mHead->next;
    if (this->mHead != (Node *)0x0) {
      operator_delete(this->mHead,0x18);
    }
    this->mHead = pNVar1;
  }
  this->mTail = (Node *)0x0;
  return;
}

Assistant:

~list()
		{
			while (mHead != NULL)
			{
				Node* temp = mHead->next;
				delete mHead;
				mHead = temp;
			}
			mTail = NULL;
		}